

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrie.c
# Opt level: O0

tommy_trie_node * tommy_trie_bucket(tommy_trie *trie,tommy_key_t key)

{
  byte bVar1;
  long in_FS_OFFSET;
  tommy_uint_t shift;
  tommy_uint_t type;
  void *ptr;
  tommy_trie_node *node;
  tommy_key_t key_local;
  tommy_trie *trie_local;
  
  _shift = (tommy_trie *)trie->bucket[key >> 0x1b];
  bVar1 = 0x1b;
  do {
    if (_shift == (tommy_trie *)0x0) {
      trie_local = (tommy_trie *)0x0;
LAB_00117e8f:
      if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
        return (tommy_trie_node *)trie_local;
      }
      __stack_chk_fail();
    }
    if (((ulong)_shift & 1) == 0) {
      if (*(tommy_key_t *)(_shift->bucket + 3) == key) {
        trie_local = _shift;
      }
      else {
        trie_local = (tommy_trie *)0x0;
      }
      goto LAB_00117e8f;
    }
    _shift = *(tommy_trie **)((long)_shift->bucket + ((ulong)(key >> (bVar1 & 0x1f)) & 7) * 8 + -1);
    bVar1 = bVar1 - 3;
  } while( true );
}

Assistant:

tommy_trie_node* tommy_trie_bucket(tommy_trie* trie, tommy_key_t key)
{
	tommy_trie_node* node;
	void* ptr;
	tommy_uint_t type;
	tommy_uint_t shift;

	ptr = trie->bucket[key >> TOMMY_TRIE_BUCKET_SHIFT];

	shift = TOMMY_TRIE_BUCKET_SHIFT;

recurse:
	if (!ptr)
		return 0;

	type = trie_get_type(ptr);

	switch (type) {
	case TOMMY_TRIE_TYPE_NODE :
		node = tommy_cast(tommy_trie_node*, ptr);
		if (node->key != key)
			return 0;
		return node;
	default :
	case TOMMY_TRIE_TYPE_TREE :
		ptr = trie_get_tree(ptr)->map[(key >> shift) & TOMMY_TRIE_TREE_MASK];
		shift -= TOMMY_TRIE_TREE_BIT;
		goto recurse;
	}
}